

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O2

void uWS::WebSocketHandshake::Sha1Loop<5>::f<9>(uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = b[0xd] ^ b[2] ^ b[7] ^ b[5];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[5] = uVar2;
  uVar1 = a[2];
  a[4] = a[4] + (a[3] << 5 | a[3] >> 0x1b) + (a[1] ^ *a ^ uVar1) + uVar2 + 0xca62c1d6;
  a[2] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

static inline uint32_t rol(uint32_t value, size_t bits) {return (value << bits) | (value >> (32 - bits));}